

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O0

Link * __thiscall Link::writeStatusChange_abi_cxx11_(Link *this,int oldStatus)

{
  ostream *poVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  long *plVar2;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  long *plStack_18;
  int oldStatus_local;
  Link *this_local;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,oldStatus);
  local_1c = in_EDX;
  plStack_18 = plVar2;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"    ");
  (**(code **)(*plVar2 + 0x18))(local_1d8);
  poVar1 = std::operator<<(poVar1,local_1d8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)(plVar2 + 1));
  poVar1 = std::operator<<(poVar1,(string *)s_From_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,(string *)(linkStatusWords_abi_cxx11_ + (long)local_1c * 0x20));
  poVar1 = std::operator<<(poVar1,(string *)s_To_abi_cxx11_);
  std::operator<<(poVar1,(string *)(linkStatusWords_abi_cxx11_ + (long)(int)plVar2[0xc] * 0x20));
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

string Link::writeStatusChange(int oldStatus)
{
    stringstream ss;
    ss << "    " << typeStr() << " " <<
	    name << s_From << linkStatusWords[oldStatus] << s_To <<
	    linkStatusWords[status];
    return ss.str();
}